

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

Film pbrt::Film::Create(string *name,ParameterDictionary *parameters,Float exposureTime,
                       CameraTransform *cameraTransform,Filter *filter,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  SpectralFilm *in_RDX;
  FileLoc *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  undefined4 in_XMM0_Da;
  FileLoc *in_stack_00000048;
  RGBColorSpace *in_stack_00000050;
  Filter *in_stack_00000058;
  Float in_stack_00000064;
  ParameterDictionary *in_stack_00000068;
  Allocator in_stack_00000070;
  Film *film;
  ParameterDictionary *in_stack_00000100;
  FileLoc *in_stack_00000178;
  RGBColorSpace *in_stack_00000180;
  Filter *in_stack_00000188;
  Float in_stack_00000194;
  ParameterDictionary *in_stack_00000198;
  Allocator in_stack_000001a0;
  FileLoc *in_stack_000006c0;
  RGBColorSpace *in_stack_000006c8;
  Filter *in_stack_000006d0;
  CameraTransform *in_stack_000006d8;
  Float in_stack_000006e4;
  ParameterDictionary *in_stack_000006e8;
  Allocator in_stack_000006f0;
  GBufferFilm *in_stack_ffffffffffffff28;
  SpectralFilm *pSVar2;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm,_pbrt::SpectralFilm> loc_00;
  
  loc_00.bits = (uint64_t)in_RDI;
  Film((Film *)0x74bd27);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (char *)in_stack_ffffffffffffff28);
  if (bVar1) {
    Filter::Filter((Filter *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (Filter *)in_stack_ffffffffffffff28);
    ParameterDictionary::ColorSpace((ParameterDictionary *)in_RDX);
    RGBFilm::Create(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000050,
                    in_stack_00000048,in_stack_00000070);
    TaggedPointer<pbrt::RGBFilm>
              ((Film *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (RGBFilm *)in_stack_ffffffffffffff28);
    operator=((Film *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
              (Film *)in_stack_ffffffffffffff28);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            (char *)in_stack_ffffffffffffff28);
    if (bVar1) {
      Filter::Filter((Filter *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (Filter *)in_stack_ffffffffffffff28);
      ParameterDictionary::ColorSpace((ParameterDictionary *)in_RDX);
      GBufferFilm::Create(in_stack_000006e8,in_stack_000006e4,in_stack_000006d8,in_stack_000006d0,
                          in_stack_000006c8,in_stack_000006c0,in_stack_000006f0);
      TaggedPointer<pbrt::GBufferFilm>
                ((Film *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      operator=((Film *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                (Film *)in_stack_ffffffffffffff28);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              (char *)in_stack_ffffffffffffff28);
      if (!bVar1) {
        ErrorExit<std::__cxx11::string_const&>((FileLoc *)loc_00.bits,(char *)in_RDI,in_R8);
      }
      pSVar2 = in_RDX;
      Filter::Filter((Filter *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff30),(Filter *)in_RDX);
      ParameterDictionary::ColorSpace((ParameterDictionary *)in_RDX);
      SpectralFilm::Create
                (in_stack_00000198,in_stack_00000194,in_stack_00000188,in_stack_00000180,
                 in_stack_00000178,in_stack_000001a0);
      TaggedPointer<pbrt::SpectralFilm>
                ((Film *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff30),pSVar2);
      operator=((Film *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff30),(Film *)pSVar2);
    }
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI);
  if (bVar1) {
    ParameterDictionary::ReportUnused(in_stack_00000100);
    return (Film)(TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm,_pbrt::SpectralFilm>)loc_00.bits;
  }
  ErrorExit<std::__cxx11::string_const&>((FileLoc *)loc_00.bits,(char *)in_RDI,in_R8);
}

Assistant:

Film Film::Create(const std::string &name, const ParameterDictionary &parameters,
                  Float exposureTime, const CameraTransform &cameraTransform,
                  Filter filter, const FileLoc *loc, Allocator alloc) {
    Film film;
    if (name == "rgb")
        film = RGBFilm::Create(parameters, exposureTime, filter, parameters.ColorSpace(),
                               loc, alloc);
    else if (name == "gbuffer")
        film = GBufferFilm::Create(parameters, exposureTime, cameraTransform, filter,
                                   parameters.ColorSpace(), loc, alloc);
    else if (name == "spectral")
        film = SpectralFilm::Create(parameters, exposureTime, filter,
                                    parameters.ColorSpace(), loc, alloc);
    else
        ErrorExit(loc, "%s: film type unknown.", name);

    if (!film)
        ErrorExit(loc, "%s: unable to create film.", name);

    parameters.ReportUnused();
    return film;
}